

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O0

int sftp_cmd_pwd(sftp_command *cmd)

{
  char *local_20;
  char *san;
  sftp_command *cmd_local;
  
  if (backend == (Backend *)0x0) {
    not_connected();
    cmd_local._4_4_ = 0;
  }
  else {
    local_20 = stripctrl_string(string_scc,pwd);
    while (local_20 != (char *)0x0) {
      printf("Remote directory is %s\n",local_20);
      safefree(local_20);
      local_20 = (char *)0x0;
    }
    cmd_local._4_4_ = 1;
  }
  return cmd_local._4_4_;
}

Assistant:

int sftp_cmd_pwd(struct sftp_command *cmd)
{
    if (!backend) {
        not_connected();
        return 0;
    }

    with_stripctrl(san, pwd)
        printf("Remote directory is %s\n", san);
    return 1;
}